

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenSIMDShuffle(BinaryenModuleRef module,BinaryenExpressionRef left,BinaryenExpressionRef right,
                   uint8_t *mask_)

{
  pointer pvVar1;
  SIMDShuffle *pSVar2;
  Builder local_40;
  undefined1 local_38 [8];
  array<unsigned_char,_16UL> mask;
  uint8_t *mask__local;
  BinaryenExpressionRef right_local;
  BinaryenExpressionRef left_local;
  BinaryenModuleRef module_local;
  
  mask._M_elems._8_8_ = mask_;
  if (mask_ != (uint8_t *)0x0) {
    pvVar1 = std::array<unsigned_char,_16UL>::data((array<unsigned_char,_16UL> *)local_38);
    *(undefined8 *)pvVar1 = *(undefined8 *)mask._M_elems._8_8_;
    *(undefined8 *)(pvVar1 + 8) = *(undefined8 *)(mask._M_elems._8_8_ + 8);
    wasm::Builder::Builder(&local_40,module);
    pSVar2 = wasm::Builder::makeSIMDShuffle
                       (&local_40,left,right,(array<unsigned_char,_16UL> *)local_38);
    return (BinaryenExpressionRef)pSVar2;
  }
  __assert_fail("mask_",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x5b3,
                "BinaryenExpressionRef BinaryenSIMDShuffle(BinaryenModuleRef, BinaryenExpressionRef, BinaryenExpressionRef, const uint8_t *)"
               );
}

Assistant:

BinaryenExpressionRef BinaryenSIMDShuffle(BinaryenModuleRef module,
                                          BinaryenExpressionRef left,
                                          BinaryenExpressionRef right,
                                          const uint8_t mask_[16]) {
  assert(mask_); // nullptr would be wrong
  std::array<uint8_t, 16> mask;
  memcpy(mask.data(), mask_, 16);
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeSIMDShuffle((Expression*)left, (Expression*)right, mask));
}